

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParsePHPCoverage.cxx
# Opt level: O3

bool __thiscall cmParsePHPCoverage::ReadPHPCoverageDirectory(cmParsePHPCoverage *this,char *d)

{
  bool bVar1;
  int iVar2;
  unsigned_long uVar3;
  char *__s;
  unsigned_long dindex;
  ulong uVar4;
  Directory dir;
  string file;
  string path;
  allocator<char> local_89;
  Directory local_88;
  string local_80;
  long *local_60 [2];
  long local_50 [2];
  cmParsePHPCoverage *local_40;
  char *local_38;
  
  local_40 = this;
  cmsys::Directory::Directory(&local_88);
  local_38 = d;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,d,(allocator<char> *)local_60);
  bVar1 = cmsys::Directory::Load(&local_88,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if (bVar1) {
    uVar3 = cmsys::Directory::GetNumberOfFiles(&local_88);
    bVar1 = true;
    if (uVar3 != 0) {
      dindex = 0;
      uVar4 = 1;
      do {
        __s = cmsys::Directory::GetFile(&local_88,dindex);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_80,__s,(allocator<char> *)local_60);
        iVar2 = std::__cxx11::string::compare((char *)&local_80);
        if (iVar2 != 0) {
          iVar2 = std::__cxx11::string::compare((char *)&local_80);
          if (iVar2 != 0) {
            bVar1 = cmsys::SystemTools::FileIsDirectory(&local_80);
            if (!bVar1) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_60,local_38,&local_89);
              std::__cxx11::string::append((char *)local_60);
              std::__cxx11::string::_M_append((char *)local_60,(ulong)local_80._M_dataplus._M_p);
              bVar1 = ReadPHPData(local_40,(char *)local_60[0]);
              if (local_60[0] != local_50) {
                operator_delete(local_60[0],local_50[0] + 1);
              }
              if (!bVar1) {
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_80._M_dataplus._M_p != &local_80.field_2) {
                  operator_delete(local_80._M_dataplus._M_p,
                                  local_80.field_2._M_allocated_capacity + 1);
                }
                goto LAB_00188d67;
              }
            }
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        bVar1 = uVar4 < uVar3;
        dindex = uVar4;
        uVar4 = (ulong)((int)uVar4 + 1);
      } while (bVar1);
      bVar1 = true;
    }
  }
  else {
LAB_00188d67:
    bVar1 = false;
  }
  cmsys::Directory::~Directory(&local_88);
  return bVar1;
}

Assistant:

bool cmParsePHPCoverage::ReadPHPCoverageDirectory(const char* d)
{
  cmsys::Directory dir;
  if (!dir.Load(d)) {
    return false;
  }
  size_t numf;
  unsigned int i;
  numf = dir.GetNumberOfFiles();
  for (i = 0; i < numf; i++) {
    std::string file = dir.GetFile(i);
    if (file != "." && file != ".." && !cmSystemTools::FileIsDirectory(file)) {
      std::string path = d;
      path += "/";
      path += file;
      if (!this->ReadPHPData(path.c_str())) {
        return false;
      }
    }
  }
  return true;
}